

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

Value * duckdb::Value::UUID(Value *__return_storage_ptr__,string *value)

{
  hugeint_t result;
  LogicalType local_40;
  hugeint_t local_28;
  
  LogicalType::LogicalType(&local_40,UUID);
  Value(__return_storage_ptr__,&local_40);
  LogicalType::~LogicalType(&local_40);
  BaseUUID::FromString(value,&local_28,false);
  (__return_storage_ptr__->value_).bigint = local_28.lower;
  (__return_storage_ptr__->value_).hugeint.upper = local_28.upper;
  __return_storage_ptr__->is_null = false;
  return __return_storage_ptr__;
}

Assistant:

Value Value::UUID(const string &value) {
	Value result(LogicalType::UUID);
	result.value_.hugeint = UUID::FromString(value);
	result.is_null = false;
	return result;
}